

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polynom.h
# Opt level: O2

Polynom<Finite> __thiscall Polynom<Finite>::operator-(Polynom<Finite> *this,Polynom<Finite> *a)

{
  Matrix<Finite> *a_00;
  Finite *extraout_RDX;
  Polynom<Finite> PVar1;
  Polynom<Finite> temp;
  Matrix<Finite> local_30;
  Matrix<Finite> local_20;
  
  Matrix<Finite>::Matrix(&local_20,&a->m);
  operator-((Polynom<Finite> *)&local_30);
  a_00 = &operator+=((Polynom<Finite> *)&local_20,(Polynom<Finite> *)&local_30)->m;
  Matrix<Finite>::Matrix(&this->m,a_00);
  Matrix<Finite>::~Matrix(&local_30);
  Matrix<Finite>::~Matrix(&local_20);
  PVar1.m.arr = extraout_RDX;
  PVar1.m._0_8_ = this;
  return (Polynom<Finite>)PVar1.m;
}

Assistant:

inline const Polynom operator-(const Polynom &a) const
    {
        Polynom temp(*this);
        return temp += -a;
    }